

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_purp.cc
# Opt level: O1

int X509_supported_extension(X509_EXTENSION *ex)

{
  int iVar1;
  ASN1_OBJECT *o;
  
  o = X509_EXTENSION_get_object(ex);
  iVar1 = OBJ_obj2nid(o);
  if (iVar1 < 0x191) {
    if ((iVar1 - 0x53U < 0x2c) && ((0x80000000055U >> ((ulong)(iVar1 - 0x53U) & 0x3f) & 1) != 0)) {
      return 1;
    }
  }
  else {
    if (iVar1 == 0x191) {
      return 1;
    }
    if (iVar1 == 0x29a) {
      return 1;
    }
    if (iVar1 == 0x2eb) {
      return 1;
    }
  }
  return (uint)(iVar1 == 0x2ec);
}

Assistant:

int X509_supported_extension(const X509_EXTENSION *ex) {
  int nid = OBJ_obj2nid(X509_EXTENSION_get_object(ex));
  return nid == NID_key_usage ||             //
         nid == NID_subject_alt_name ||      //
         nid == NID_basic_constraints ||     //
         nid == NID_certificate_policies ||  //
         nid == NID_ext_key_usage ||         //
         nid == NID_policy_constraints ||    //
         nid == NID_name_constraints ||      //
         nid == NID_policy_mappings ||       //
         nid == NID_inhibit_any_policy;
}